

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic_tuple.hpp
# Opt level: O2

int8_t * __thiscall
burst::dynamic_tuple::set_up_creation_place<char>(dynamic_tuple *this,char *object)

{
  size_t sVar1;
  char *pcVar2;
  int8_t *piVar3;
  
  sVar1 = this->m_volume;
  pcVar2 = (this->m_data)._M_t.
           super___uniq_ptr_impl<signed_char,_std::default_delete<signed_char[]>_>._M_t.
           super__Tuple_impl<0UL,_signed_char_*,_std::default_delete<signed_char[]>_>.
           super__Head_base<0UL,_signed_char_*,_false>._M_head_impl;
  if (pcVar2 == (char *)0x0 || this->m_capacity == sVar1) {
    reserve(this,sVar1 + 2);
    piVar3 = force_align<char>(this,object);
    return piVar3;
  }
  return pcVar2 + sVar1;
}

Assistant:

std::int8_t * set_up_creation_place (const T & object)
        {
            if (auto proposed_creation_place = try_to_align(object))
            {
                return proposed_creation_place;
            }
            else
            {
                reserve(volume() + sizeof(T) + alignof(T));
                return force_align(object);
            }
        }